

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

long openjtalk_getWideCharCode(char16_t *text)

{
  bool bVar1;
  ulong uVar2;
  bool bVar3;
  
  if (text == (char16_t *)0x0) {
    return 0xc;
  }
  uVar2 = 0;
  bVar3 = false;
  do {
    if ((ulong)*text == 0) {
      return uVar2;
    }
    uVar2 = uVar2 << 0x10 | (ulong)*text;
    text = text + 1;
    bVar1 = !bVar3;
    bVar3 = true;
  } while (bVar1);
  return uVar2;
}

Assistant:

OPENJTALK_DLL_API long OPENJTALK_CONVENTION openjtalk_getWideCharCode(char16_t *text)
{
	if (!text)
	{
		return OPENJTALKERROR_BUFFER_IS_NULL;
	}
	long res = 0;
	int count = 0;
	for (char16_t *p = text; *p != '\0'; p++)
	{
		res <<= sizeof(char16_t) * 8;
		res += ((long)*p) & 0xffff;
		if (++count == 2)
		{
			break;
		}
	}
	return (long)res;
}